

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<QString>::
     call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>,tst_helpers_attempt::typedResult()::__0>
               (QPromiseReject<QString> *resolve,QPromiseReject<QString> *reject)

{
  QString local_38;
  QPromiseReject<QString> *local_20;
  QPromiseReject<QString> *reject_local;
  QPromiseResolve<QString> *resolve_local;
  
  local_20 = reject;
  reject_local = resolve;
  tst_helpers_attempt::typedResult::anon_class_1_0_00000001::operator()
            (&local_38,(anon_class_1_0_00000001 *)((long)&resolve_local + 7));
  PromiseFulfill<QString>::
  call<QString,QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
            (&local_38,(QPromiseResolve<QString> *)reject_local,local_20);
  QString::~QString(&local_38);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }